

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chess.cpp
# Opt level: O0

uint64_t __thiscall banksia::ChessBoard::xorHashKey(ChessBoard *this,int pos)

{
  Side SVar1;
  PieceType PVar2;
  int iVar3;
  int iVar4;
  const_reference pvVar5;
  int in_ESI;
  long *in_RDI;
  int offset_piece;
  int row;
  int file;
  int kind_of_piece;
  int sd;
  
  pvVar5 = std::vector<banksia::Piece,_std::allocator<banksia::Piece>_>::operator[]
                     ((vector<banksia::Piece,_std::allocator<banksia::Piece>_> *)(in_RDI + 1),
                      (long)in_ESI);
  SVar1 = pvVar5->side;
  pvVar5 = std::vector<banksia::Piece,_std::allocator<banksia::Piece>_>::operator[]
                     ((vector<banksia::Piece,_std::allocator<banksia::Piece>_> *)(in_RDI + 1),
                      (long)in_ESI);
  PVar2 = pvVar5->type;
  iVar3 = (**(code **)(*in_RDI + 0x40))(in_RDI,in_ESI);
  iVar4 = (**(code **)(*in_RDI + 0x48))(in_RDI,in_ESI);
  return RandomPiece[(int)(((6 - PVar2) * 2 + SVar1) * 0x40 + (7 - iVar4) * 8 + iVar3)];
}

Assistant:

u64 ChessBoard::xorHashKey(int pos) const
{
    assert(isPositionValid(pos ));
    assert(!pieces[pos].isEmpty());
    
    auto sd = static_cast<int>(pieces[pos].side);
    auto kind_of_piece = (6 - static_cast<int>(pieces[pos].type)) * 2 + sd; assert(kind_of_piece >= 0 && kind_of_piece <= 11);
    
    auto file = getColumn(pos), row = 7 - getRow(pos);
    auto offset_piece = 64 * kind_of_piece + 8 * row + file;
    
    return RandomPiece[offset_piece];
}